

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

Half deqp::gls::roundTo<deqp::gls::GLValue::Half>(Half *step,Half *value)

{
  Half HVar1;
  Half local_a;
  
  local_a = GLValue::Half::operator%(value,step);
  HVar1 = GLValue::Half::operator-(value,&local_a);
  return (Half)HVar1.m_value;
}

Assistant:

T roundTo (const T& step, const T& value)
{
	return value - (value % step);
}